

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

bool __thiscall
cmFindPackageCommand::SearchFrameworkPrefix(cmFindPackageCommand *this,string *prefix_in)

{
  FILE *__stream;
  uint uVar1;
  char *pcVar2;
  undefined8 uVar3;
  cmFileList *pcVar4;
  bool bVar5;
  allocator local_549;
  string local_548;
  cmFileListGeneratorCaseInsensitive local_528;
  allocator local_4f1;
  string local_4f0;
  cmFileListGeneratorGlob local_4d0;
  allocator local_499;
  string local_498;
  cmFileListGeneratorFixed local_478;
  cmFileListGeneratorMacProject local_448;
  cmFileListGeneratorFixed local_410;
  undefined1 local_3e0 [8];
  cmFindPackageFileList lister_3;
  string local_3b0;
  cmFileListGeneratorGlob local_390;
  allocator local_359;
  string local_358;
  cmFileListGeneratorFixed local_338;
  cmFileListGeneratorMacProject local_308;
  cmFileListGeneratorFixed local_2d0;
  undefined1 local_2a0 [8];
  cmFindPackageFileList lister_2;
  string local_270;
  cmFileListGeneratorCaseInsensitive local_250;
  allocator local_219;
  string local_218;
  cmFileListGeneratorFixed local_1f8;
  cmFileListGeneratorMacProject local_1c8;
  cmFileListGeneratorFixed local_190;
  undefined1 local_160 [8];
  cmFindPackageFileList lister_1;
  string local_130;
  cmFileListGeneratorFixed local_110;
  cmFileListGeneratorMacProject local_e0;
  cmFileListGeneratorFixed local_a8;
  undefined1 local_68 [8];
  cmFindPackageFileList lister;
  string prefix;
  string *prefix_in_local;
  cmFindPackageCommand *this_local;
  
  uVar1 = std::__cxx11::string::empty();
  bVar5 = false;
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::size();
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)prefix_in);
    bVar5 = *pcVar2 == '/';
  }
  __stream = _stderr;
  if (bVar5) {
    if ((this->DebugMode & 1U) != 0) {
      uVar3 = std::__cxx11::string::c_str();
      fprintf(__stream,"Checking framework prefix [%s]\n",uVar3);
    }
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)&lister.UseSuffixes,(ulong)prefix_in);
    cmFindPackageFileList::cmFindPackageFileList((cmFindPackageFileList *)local_68,this,true);
    cmFileListGeneratorFixed::cmFileListGeneratorFixed(&local_a8,(string *)&lister.UseSuffixes);
    pcVar4 = cmFileList::operator/((cmFileList *)local_68,&local_a8.super_cmFileListGeneratorBase);
    cmFileListGeneratorMacProject::cmFileListGeneratorMacProject
              (&local_e0,&this->Names,".framework");
    pcVar4 = cmFileList::operator/(pcVar4,&local_e0.super_cmFileListGeneratorBase);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_130,"Resources",(allocator *)&lister_1.field_0x27)
    ;
    cmFileListGeneratorFixed::cmFileListGeneratorFixed(&local_110,&local_130);
    cmFileList::operator/(pcVar4,&local_110.super_cmFileListGeneratorBase);
    cmFileListGeneratorFixed::~cmFileListGeneratorFixed(&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator((allocator<char> *)&lister_1.field_0x27);
    cmFileListGeneratorMacProject::~cmFileListGeneratorMacProject(&local_e0);
    cmFileListGeneratorFixed::~cmFileListGeneratorFixed(&local_a8);
    lister_1.UseSuffixes = cmFileList::Search((cmFileList *)local_68);
    if (lister_1.UseSuffixes) {
      this_local._7_1_ = 1;
    }
    lister_1._33_3_ = 0;
    cmFindPackageFileList::~cmFindPackageFileList((cmFindPackageFileList *)local_68);
    if (lister_1._32_4_ == 0) {
      cmFindPackageFileList::cmFindPackageFileList((cmFindPackageFileList *)local_160,this,true);
      cmFileListGeneratorFixed::cmFileListGeneratorFixed(&local_190,(string *)&lister.UseSuffixes);
      pcVar4 = cmFileList::operator/
                         ((cmFileList *)local_160,&local_190.super_cmFileListGeneratorBase);
      cmFileListGeneratorMacProject::cmFileListGeneratorMacProject
                (&local_1c8,&this->Names,".framework");
      pcVar4 = cmFileList::operator/(pcVar4,&local_1c8.super_cmFileListGeneratorBase);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_218,"Resources",&local_219);
      cmFileListGeneratorFixed::cmFileListGeneratorFixed(&local_1f8,&local_218);
      pcVar4 = cmFileList::operator/(pcVar4,&local_1f8.super_cmFileListGeneratorBase);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_270,"cmake",(allocator *)&lister_2.field_0x27);
      cmFileListGeneratorCaseInsensitive::cmFileListGeneratorCaseInsensitive(&local_250,&local_270);
      cmFileList::operator/(pcVar4,&local_250.super_cmFileListGeneratorBase);
      cmFileListGeneratorCaseInsensitive::~cmFileListGeneratorCaseInsensitive(&local_250);
      std::__cxx11::string::~string((string *)&local_270);
      std::allocator<char>::~allocator((allocator<char> *)&lister_2.field_0x27);
      cmFileListGeneratorFixed::~cmFileListGeneratorFixed(&local_1f8);
      std::__cxx11::string::~string((string *)&local_218);
      std::allocator<char>::~allocator((allocator<char> *)&local_219);
      cmFileListGeneratorMacProject::~cmFileListGeneratorMacProject(&local_1c8);
      cmFileListGeneratorFixed::~cmFileListGeneratorFixed(&local_190);
      lister_1.UseSuffixes = cmFileList::Search((cmFileList *)local_160);
      if (lister_1.UseSuffixes) {
        this_local._7_1_ = 1;
      }
      lister_1._33_3_ = 0;
      cmFindPackageFileList::~cmFindPackageFileList((cmFindPackageFileList *)local_160);
      if (lister_1._32_4_ == 0) {
        cmFindPackageFileList::cmFindPackageFileList((cmFindPackageFileList *)local_2a0,this,true);
        cmFileListGeneratorFixed::cmFileListGeneratorFixed(&local_2d0,(string *)&lister.UseSuffixes)
        ;
        pcVar4 = cmFileList::operator/
                           ((cmFileList *)local_2a0,&local_2d0.super_cmFileListGeneratorBase);
        cmFileListGeneratorMacProject::cmFileListGeneratorMacProject
                  (&local_308,&this->Names,".framework");
        pcVar4 = cmFileList::operator/(pcVar4,&local_308.super_cmFileListGeneratorBase);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_358,"Versions",&local_359);
        cmFileListGeneratorFixed::cmFileListGeneratorFixed(&local_338,&local_358);
        pcVar4 = cmFileList::operator/(pcVar4,&local_338.super_cmFileListGeneratorBase);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_3b0,"*/Resources",(allocator *)&lister_3.field_0x27);
        cmFileListGeneratorGlob::cmFileListGeneratorGlob(&local_390,&local_3b0);
        cmFileList::operator/(pcVar4,&local_390.super_cmFileListGeneratorBase);
        cmFileListGeneratorGlob::~cmFileListGeneratorGlob(&local_390);
        std::__cxx11::string::~string((string *)&local_3b0);
        std::allocator<char>::~allocator((allocator<char> *)&lister_3.field_0x27);
        cmFileListGeneratorFixed::~cmFileListGeneratorFixed(&local_338);
        std::__cxx11::string::~string((string *)&local_358);
        std::allocator<char>::~allocator((allocator<char> *)&local_359);
        cmFileListGeneratorMacProject::~cmFileListGeneratorMacProject(&local_308);
        cmFileListGeneratorFixed::~cmFileListGeneratorFixed(&local_2d0);
        lister_1.UseSuffixes = cmFileList::Search((cmFileList *)local_2a0);
        if (lister_1.UseSuffixes) {
          this_local._7_1_ = 1;
        }
        lister_1._33_3_ = 0;
        cmFindPackageFileList::~cmFindPackageFileList((cmFindPackageFileList *)local_2a0);
        if (lister_1._32_4_ == 0) {
          cmFindPackageFileList::cmFindPackageFileList((cmFindPackageFileList *)local_3e0,this,true)
          ;
          cmFileListGeneratorFixed::cmFileListGeneratorFixed
                    (&local_410,(string *)&lister.UseSuffixes);
          pcVar4 = cmFileList::operator/
                             ((cmFileList *)local_3e0,&local_410.super_cmFileListGeneratorBase);
          cmFileListGeneratorMacProject::cmFileListGeneratorMacProject
                    (&local_448,&this->Names,".framework");
          pcVar4 = cmFileList::operator/(pcVar4,&local_448.super_cmFileListGeneratorBase);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_498,"Versions",&local_499);
          cmFileListGeneratorFixed::cmFileListGeneratorFixed(&local_478,&local_498);
          pcVar4 = cmFileList::operator/(pcVar4,&local_478.super_cmFileListGeneratorBase);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_4f0,"*/Resources",&local_4f1);
          cmFileListGeneratorGlob::cmFileListGeneratorGlob(&local_4d0,&local_4f0);
          pcVar4 = cmFileList::operator/(pcVar4,&local_4d0.super_cmFileListGeneratorBase);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_548,"cmake",&local_549);
          cmFileListGeneratorCaseInsensitive::cmFileListGeneratorCaseInsensitive
                    (&local_528,&local_548);
          cmFileList::operator/(pcVar4,&local_528.super_cmFileListGeneratorBase);
          cmFileListGeneratorCaseInsensitive::~cmFileListGeneratorCaseInsensitive(&local_528);
          std::__cxx11::string::~string((string *)&local_548);
          std::allocator<char>::~allocator((allocator<char> *)&local_549);
          cmFileListGeneratorGlob::~cmFileListGeneratorGlob(&local_4d0);
          std::__cxx11::string::~string((string *)&local_4f0);
          std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
          cmFileListGeneratorFixed::~cmFileListGeneratorFixed(&local_478);
          std::__cxx11::string::~string((string *)&local_498);
          std::allocator<char>::~allocator((allocator<char> *)&local_499);
          cmFileListGeneratorMacProject::~cmFileListGeneratorMacProject(&local_448);
          cmFileListGeneratorFixed::~cmFileListGeneratorFixed(&local_410);
          lister_1.UseSuffixes = cmFileList::Search((cmFileList *)local_3e0);
          if (lister_1.UseSuffixes) {
            this_local._7_1_ = 1;
          }
          lister_1._33_3_ = 0;
          cmFindPackageFileList::~cmFindPackageFileList((cmFindPackageFileList *)local_3e0);
          if (lister_1._32_4_ == 0) {
            this_local._7_1_ = 0;
            lister_1.UseSuffixes = true;
            lister_1._33_3_ = 0;
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&lister.UseSuffixes);
    return (bool)(this_local._7_1_ & 1);
  }
  __assert_fail("!prefix_in.empty() && prefix_in[prefix_in.size() - 1] == \'/\'",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmFindPackageCommand.cxx"
                ,0x86c,"bool cmFindPackageCommand::SearchFrameworkPrefix(const std::string &)");
}

Assistant:

bool cmFindPackageCommand::SearchFrameworkPrefix(std::string const& prefix_in)
{
  assert(!prefix_in.empty() && prefix_in[prefix_in.size() - 1] == '/');
  if (this->DebugMode) {
    fprintf(stderr, "Checking framework prefix [%s]\n", prefix_in.c_str());
  }

  // Strip the trailing slash because the path generator is about to
  // add one.
  std::string prefix = prefix_in.substr(0, prefix_in.size() - 1);

  // <prefix>/Foo.framework/Resources/
  {
    cmFindPackageFileList lister(this);
    lister / cmFileListGeneratorFixed(prefix) /
      cmFileListGeneratorMacProject(this->Names, ".framework") /
      cmFileListGeneratorFixed("Resources");
    if (lister.Search()) {
      return true;
    }
  }
  // <prefix>/Foo.framework/Resources/CMake/
  {
    cmFindPackageFileList lister(this);
    lister / cmFileListGeneratorFixed(prefix) /
      cmFileListGeneratorMacProject(this->Names, ".framework") /
      cmFileListGeneratorFixed("Resources") /
      cmFileListGeneratorCaseInsensitive("cmake");
    if (lister.Search()) {
      return true;
    }
  }

  // <prefix>/Foo.framework/Versions/*/Resources/
  {
    cmFindPackageFileList lister(this);
    lister / cmFileListGeneratorFixed(prefix) /
      cmFileListGeneratorMacProject(this->Names, ".framework") /
      cmFileListGeneratorFixed("Versions") /
      cmFileListGeneratorGlob("*/Resources");
    if (lister.Search()) {
      return true;
    }
  }

  // <prefix>/Foo.framework/Versions/*/Resources/CMake/
  {
    cmFindPackageFileList lister(this);
    lister / cmFileListGeneratorFixed(prefix) /
      cmFileListGeneratorMacProject(this->Names, ".framework") /
      cmFileListGeneratorFixed("Versions") /
      cmFileListGeneratorGlob("*/Resources") /
      cmFileListGeneratorCaseInsensitive("cmake");
    if (lister.Search()) {
      return true;
    }
  }

  return false;
}